

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

string * CreateFlatBufferTest_abi_cxx11_(void)

{
  Offset<flatbuffers::String> OVar1;
  uoffset_t uVar2;
  uint8_t *puVar3;
  string *in_RDI;
  allocator local_fd;
  uoffset_t local_fc;
  uoffset_t local_f8;
  uoffset_t local_f4;
  Test local_f0;
  Offset<flatbuffers::String> local_ec;
  uoffset_t local_e8;
  Offset<MyGame::Example::Monster> local_e4;
  Offset<MyGame::Example::Monster> mloc;
  Offset<MyGame::Example::Monster> mloc2;
  MonsterBuilder mb;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*>_> testv;
  Test tests [2];
  Offset<flatbuffers::Vector<unsigned_char>_> inventory;
  uchar inv_data [10];
  Offset<flatbuffers::String> name;
  Test local_9c;
  undefined1 local_98 [8];
  Vec3 vec;
  undefined1 local_70 [8];
  FlatBufferBuilder builder;
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder((FlatBufferBuilder *)local_70,0x400);
  MyGame::Example::Test::Test(&local_9c,10,'\x14');
  MyGame::Example::Vec3::Vec3((Vec3 *)local_98,1.0,2.0,3.0,0.0,'\0',&local_9c);
  OVar1 = flatbuffers::FlatBufferBuilder::CreateString((FlatBufferBuilder *)local_70,"MyMonster");
  stack0xffffffffffffff40 = 0x706050403020100;
  tests[0] = (Test)flatbuffers::FlatBufferBuilder::CreateVector<unsigned_char>
                             ((FlatBufferBuilder *)local_70,(uchar *)(tests + 1),10);
  MyGame::Example::Test::Test((Test *)&mb.field_0xc,10,'\x14');
  MyGame::Example::Test::Test((Test *)&testv,0x1e,'(');
  mb.start_ = (uoffset_t)
              flatbuffers::FlatBufferBuilder::CreateVectorOfStructs<MyGame::Example::Test>
                        ((FlatBufferBuilder *)local_70,(Test *)&mb.field_0xc,2);
  MyGame::Example::MonsterBuilder::MonsterBuilder
            ((MonsterBuilder *)&mloc,(FlatBufferBuilder *)local_70);
  MyGame::Example::MonsterBuilder::add_hp((MonsterBuilder *)&mloc,0x14);
  local_e4 = MyGame::Example::MonsterBuilder::Finish((MonsterBuilder *)&mloc);
  local_f0 = tests[0];
  local_ec = OVar1;
  local_f4 = (uoffset_t)flatbuffers::Offset<MyGame::Example::Monster>::Union(&local_e4);
  local_f8 = mb.start_;
  local_fc = (uoffset_t)
             MyGame::Example::CreateMonster
                       ((FlatBufferBuilder *)local_70,(Vec3 *)local_98,0x96,0x50,local_ec,
                        (Offset<flatbuffers::Vector<unsigned_char>_>)local_f0,'\x02','\x01',
                        (Offset<void>)local_f4,
                        (Offset<flatbuffers::Vector<const_MyGame::Example::Test_*>_>)mb.start_);
  local_e8 = local_fc;
  flatbuffers::FlatBufferBuilder::Finish<MyGame::Example::Monster>
            ((FlatBufferBuilder *)local_70,(Offset<MyGame::Example::Monster>)local_fc);
  puVar3 = flatbuffers::FlatBufferBuilder::GetBufferPointer((FlatBufferBuilder *)local_70);
  uVar2 = flatbuffers::FlatBufferBuilder::GetSize((FlatBufferBuilder *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,(char *)puVar3,(ulong)uVar2,&local_fd);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd);
  flatbuffers::FlatBufferBuilder::~FlatBufferBuilder((FlatBufferBuilder *)local_70);
  return in_RDI;
}

Assistant:

std::string CreateFlatBufferTest() {
  flatbuffers::FlatBufferBuilder builder;

  auto vec = Vec3(1, 2, 3, 0, 0, Test(10, 20));

  auto name = builder.CreateString("MyMonster");

  unsigned char inv_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9 };
  auto inventory = builder.CreateVector(inv_data, 10);

  Test tests[] = { Test(10, 20), Test(30, 40) };
  auto testv = builder.CreateVectorOfStructs(tests, 2);

  // create monster with very few fields set:
  // (same functionality as CreateMonster below, but sets fields manually)
  MonsterBuilder mb(builder);
  mb.add_hp(20);
  auto mloc2 = mb.Finish();

  // shortcut for creating monster with all fields set:
  auto mloc = CreateMonster(builder, &vec, 150, 80, name, inventory, Color_Blue,
                            Any_Monster, mloc2.Union(), // Store a union.
                            testv);

  builder.Finish(mloc);

  #ifdef FLATBUFFERS_TEST_VERBOSE
  // print byte data for debugging:
  auto p = builder.GetBufferPointer();
  for (flatbuffers::uoffset_t i = 0; i < builder.GetSize(); i++)
    printf("%d ", p[i]);
  #endif

  // return the buffer for the caller to use.
  return std::string(reinterpret_cast<const char *>(builder.GetBufferPointer()),
                     builder.GetSize());
}